

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_icelance(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  AFFECT_DATA af;
  
  iVar2 = dice(level,3);
  bVar1 = is_ground(ch->in_room);
  if (bVar1) {
    bVar1 = saves_spell(level,(CHAR_DATA *)vo,5);
    act("You gesture at the ground and a jagged lance of ice erupts, impaling $N!",ch,(void *)0x0,vo
        ,3);
    act("$n gestures at the ground and a jagged lance of ice erupts, impaling you!",ch,(void *)0x0,
        vo,2);
    act("$n gestures at the ground and a jagged lance of ice erupts, impaling $N!",ch,(void *)0x0,vo
        ,1);
    damage_new(ch,(CHAR_DATA *)vo,iVar2 << !bVar1,sn,2,true,false,0,1,(char *)0x0);
    iVar2 = number_percent();
    if (iVar2 < 0x10) {
      init_affect(&af);
      af.where = 0;
      af.duration = 8;
      af.type = gsn_bleeding;
      af.location = 0;
      af.modifier = 0;
      af.aftype = 3;
      af.tick_fun = bleeding_tick;
      af.end_fun = (AFF_FUN *)0x0;
      af.owner = ch;
      af.level = (short)level;
      new_affect_to_char((CHAR_DATA *)vo,&af);
      act("Blood spills forth from your gaping wound!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
      act("Blood begins to pour from $n\'s gaping wound!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0)
      ;
    }
    return;
  }
  send_to_char("You must have ground beneath you to cast this spell.\n\r",ch);
  return;
}

Assistant:

void spell_icelance(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;
	int dam = 2 * dice(level, 3);

	if (!is_ground(ch->in_room))
	{
		send_to_char("You must have ground beneath you to cast this spell.\n\r", ch);
		return;
	}

	if (saves_spell(level, victim, DAM_COLD))
		dam /= 2;

	act("You gesture at the ground and a jagged lance of ice erupts, impaling $N!", ch, 0, victim, TO_CHAR);
	act("$n gestures at the ground and a jagged lance of ice erupts, impaling you!", ch, 0, victim, TO_VICT);
	act("$n gestures at the ground and a jagged lance of ice erupts, impaling $N!", ch, 0, victim, TO_NOTVICT);

	damage_new(ch, victim, dam, sn, DAM_PIERCE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);

	if (number_percent() <= 15)
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.duration = 8;
		af.type = gsn_bleeding;
		af.level = level;
		af.location = 0;
		af.modifier = 0;
		af.aftype = AFT_MALADY;
		af.tick_fun = bleeding_tick;
		af.end_fun = nullptr;
		af.owner = ch;
		new_affect_to_char(victim, &af);

		act("Blood spills forth from your gaping wound!", victim, 0, 0, TO_CHAR);
		act("Blood begins to pour from $n's gaping wound!", victim, 0, 0, TO_ROOM);
	}
}